

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moldudp.hh
# Opt level: O2

size_t __thiscall
helix::nasdaq::moldudp_session<helix::nasdaq::nordic_itch_handler>::process_packet
          (moldudp_session<helix::nasdaq::nordic_itch_handler> *this,packet_view *packet)

{
  char *pcVar1;
  truncated_packet_error *this_00;
  runtime_error *this_01;
  int i;
  uint uVar2;
  ushort *puVar3;
  allocator local_f9;
  string local_f8;
  packet_view *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (packet->_len < 0x10) {
    this_00 = (truncated_packet_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_f8,"MoldUDP header is truncated",(allocator *)&local_d0);
    truncated_packet_error::truncated_packet_error(this_00,&local_f8);
    __cxa_throw(this_00,&truncated_packet_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = packet->_buf;
  local_d8 = packet;
  if (*(uint32_t *)(pcVar1 + 10) == this->_seq_num) {
    puVar3 = (ushort *)(pcVar1 + 0x10);
    for (uVar2 = 0; uVar2 < *(ushort *)(pcVar1 + 0xe); uVar2 = uVar2 + 1) {
      local_f8._M_dataplus._M_p = (pointer)(puVar3 + 1);
      local_f8._M_string_length = (size_type)*puVar3;
      nordic_itch_handler::process_packet(&this->_handler,(packet_view *)&local_f8);
      puVar3 = (ushort *)((long)puVar3 + (ulong)*puVar3 + 2);
      this->_seq_num = this->_seq_num + 1;
    }
    return (long)puVar3 - (long)local_d8->_buf;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_70,"invalid sequence number: ",&local_f9);
  std::__cxx11::to_string(&local_90,*(uint *)(pcVar1 + 10));
  std::operator+(&local_50,&local_70,&local_90);
  std::operator+(&local_d0,&local_50,", expected: ");
  std::__cxx11::to_string(&local_b0,this->_seq_num);
  std::operator+(&local_f8,&local_d0,&local_b0);
  std::runtime_error::runtime_error(this_01,(string *)&local_f8);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t moldudp_session<Handler>::process_packet(const net::packet_view& packet)
{
    auto* p = packet.buf();
    if (packet.len() < sizeof(moldudp_header)) {
        throw truncated_packet_error("MoldUDP header is truncated");
    }
    auto* header = packet.cast<moldudp_header>();
    if (header->SequenceNumber != _seq_num) {
        throw std::runtime_error(std::string("invalid sequence number: ") + std::to_string(header->SequenceNumber) + ", expected: " + std::to_string(_seq_num));
    }
    p += sizeof(moldudp_header);

    for (int i = 0; i < header->MessageCount; i++) {
        auto* msg_block = reinterpret_cast<const moldudp_message_block*>(p);

        p += sizeof(moldudp_message_block);

        _handler.process_packet(net::packet_view{p, msg_block->MessageLength});

        p += msg_block->MessageLength;

        _seq_num++;
    }

    return p - packet.buf();
}